

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool has_teleport_destination_prereqs(chunk *c,loc_conflict grid,_Bool is_player_moving)

{
  _Bool _Var1;
  square_conflict *psVar2;
  _Bool is_player_moving_local;
  chunk *c_local;
  loc_conflict grid_local;
  
  if (is_player_moving) {
    _Var1 = square_ispassable(c,grid);
    if (!_Var1) {
      return false;
    }
    _Var1 = square_isplayertrap(c,grid);
    if (_Var1) {
      return false;
    }
  }
  else {
    _Var1 = square_is_monster_walkable(c,grid);
    if (!_Var1) {
      return false;
    }
    _Var1 = square_iswarded(c,grid);
    if (_Var1) {
      return false;
    }
  }
  psVar2 = square(c,grid);
  if ((((psVar2->mon != 0) || (_Var1 = square_isdamaging(c,grid), _Var1)) ||
      (_Var1 = square_isfall(c,grid), _Var1)) ||
     ((_Var1 = square_iswebbed(c,grid), _Var1 || (_Var1 = square_isshop(c,grid), _Var1)))) {
    grid_local.x._3_1_ = false;
  }
  else {
    grid_local.x._3_1_ = true;
  }
  return grid_local.x._3_1_;
}

Assistant:

static bool has_teleport_destination_prereqs(struct chunk *c, struct loc grid,
		bool is_player_moving)
{
	if (is_player_moving) {
		if (!square_ispassable(c, grid)) {
			return false;
		}
		if (square_isplayertrap(c, grid)) {
			return false;
		}
	} else {
		if (!square_is_monster_walkable(c, grid)) {
			return false;
		}
		if (square_iswarded(c, grid)) {
			return false;
		}
	}
	if (square(c, grid)->mon
			|| square_isdamaging(c, grid)
			|| square_isfall(c, grid)
			|| square_iswebbed(c, grid)
			|| square_isshop(c, grid)) {
		return false;
	}
	return true;
}